

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_tracer.h
# Opt level: O2

stepping_variable __thiscall
AbstractIsolineTracer<double>::determine_integration_type(AbstractIsolineTracer<double> *this)

{
  stepping_variable sVar1;
  stepping_variable sVar2;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *this_00;
  allocator local_39;
  double local_38;
  string local_30;
  
  sVar2 = this->mode;
  if (this->mode == STEP_INVALID) {
    if (this->imposed_variable == IMPOSED_P) {
      local_38 = this->imposed_value;
      _Var3 = std::
              __max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((this->pc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->pc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      sVar1 = STEP_IN_T;
    }
    else {
      if (this->imposed_variable != IMPOSED_T) {
        this_00 = (CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *)
                  __cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_30,"Invalid imposed variable",&local_39);
        CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::CoolPropError
                  (this_00,&local_30,eValue);
        __cxa_throw(this_00,&CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::
                             typeinfo,CoolProp::CoolPropBaseError::~CoolPropBaseError);
      }
      local_38 = this->imposed_value;
      this->m_T = local_38;
      _Var3 = std::
              __min_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((this->Tc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->Tc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      sVar1 = STEP_IN_P;
    }
    sVar2 = STEP_IN_RHO0;
    if (*_Var3._M_current <= local_38) {
      sVar2 = sVar1;
    }
  }
  return sVar2;
}

Assistant:

virtual stepping_variable determine_integration_type() {

        // If already specified, override the default logic
        if (this->mode != STEP_INVALID) {
            return this->mode;
        }

        stepping_variable mode;
        if (imposed_variable == IMPOSED_T) {
            m_T = imposed_value;
            if (m_T < *std::min_element(Tc.cbegin(), Tc.cend())) {
                // This is a subcritical isotherm, T is less than both critical temperatures
                mode = AbstractIsolineTracer::STEP_IN_RHO0;
            }
            else {
                mode = AbstractIsolineTracer::STEP_IN_P;
            }
        }
        else if (imposed_variable == IMPOSED_P) {
            if (imposed_value < *std::max_element(pc.cbegin(), pc.cend())) {
                // This is a subcritical isobar, p is less than both critical pressures. Therefore
                // we will step in the concentration of one of the components of the binary. 
                mode = AbstractIsolineTracer::STEP_IN_RHO0;
            }
            else {
                mode = AbstractIsolineTracer::STEP_IN_T;
            }
        }
        else {
            throw ValueError("Invalid imposed variable");
        }
        return mode;
    }